

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::EmptyConstraintPS::execute
          (EmptyConstraintPS *this,VectorBase<double> *param_1,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *param_4,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  VarStatus *pVVar5;
  
  iVar1 = this->m_i;
  iVar2 = this->m_old_i;
  pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar1 == iVar2) {
    pVVar5 = rStatus->data;
  }
  else {
    pdVar3[iVar2] = pdVar3[iVar1];
    pdVar4[iVar2] = pdVar4[iVar1];
    pVVar5 = rStatus->data;
    pVVar5[iVar2] = pVVar5[iVar1];
  }
  pdVar3[iVar1] = 0.0;
  pdVar4[iVar1] = this->m_row_obj;
  pVVar5[iVar1] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::EmptyConstraintPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // primal:
   s[m_i] = 0.0;

   // dual:
   y[m_i] = m_row_obj;

   // basis:
   rStatus[m_i] = SPxSolverBase<R>::BASIC;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM16 Dimension doesn't match after this step.");
   }

#endif
}